

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O0

array<unsigned_char,_4UL>
mvm::num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>(string *str)

{
  int __base;
  array<unsigned_char,_4UL> aVar1;
  unsigned_long_long val;
  reference bytes;
  to_endian<4UL,_mvm::num::little_endian_tag,_mvm::num::little_endian_tag> local_4d [13];
  string local_40;
  _Type local_20;
  array<unsigned_char,_4UL> local_1c;
  string *psStack_18;
  array<unsigned_char,_4UL> res;
  string *str_local;
  
  psStack_18 = str;
  std::__cxx11::string::string((string *)&local_40,(string *)str);
  __base = details::base(&local_40);
  val = std::__cxx11::stoull(str,(size_t *)0x0,__base);
  local_20 = (_Type)serial_unsigned<4ul>(val);
  local_1c = (array<unsigned_char,_4UL>)local_20;
  std::__cxx11::string::~string((string *)&local_40);
  bytes = std::array<unsigned_char,_4UL>::operator[](&local_1c,0);
  aVar1 = details::to_endian<4UL,_mvm::num::little_endian_tag,_mvm::num::little_endian_tag>::
          operator()(local_4d,bytes);
  return (array<unsigned_char,_4UL>)aVar1._M_elems;
}

Assistant:

std::array<uint8_t, N> serial(std::string const &str) {
  std::array<uint8_t, N> res;
  if constexpr (std::is_floating_point_v<T>) {
    res = serial_floating<T, N>(std::stod(str));
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    res = serial_unsigned<N>(std::stoull(str, nullptr, details::base(str)));
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    res = serial_signed<T, N>(std::stoll(str, nullptr, details::base(str)));
  }

  return details::to_endian<N, little_endian_tag, Endian>()(&res[0]);
}